

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalGenerator::GetLanguageOutputExtension
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *lang)

{
  const_iterator cVar1;
  allocator<char> local_11;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->LanguageToOutputExtension)._M_t,lang);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->LanguageToOutputExtension)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(cVar1._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  std::string const& lang) const
{
  auto const it = this->LanguageToOutputExtension.find(lang);
  if (it != this->LanguageToOutputExtension.end()) {
    return it->second;
  }
  return "";
}